

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O2

void embree::sse2::
     feature_adaptive_eval_grid<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
               (GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *patch,uint subPatch,
               float *levels,uint x0,uint x1,uint y0,uint y1,uint swidth,uint sheight,float *Px,
               float *Py,float *Pz,float *U,float *V,float *Nx,float *Ny,float *Nz,uint dwidth,
               uint dheight)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float *Nx_00;
  uint uVar5;
  float *Ny_00;
  float *Nz_00;
  uint local_bc;
  FeatureAdaptiveEvalGrid local_98;
  
  if (levels == (float *)0x0) {
    iVar2 = 0;
    uVar5 = 0;
    iVar4 = 0;
    local_bc = 0;
  }
  else {
    local_bc = 0;
    if (x0 == 0) {
      bVar1 = stitch_col<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,false,y0,y1,sheight - 1,(int)levels[3],Px,Py,Pz,U,V,Nx,Ny,Nz
                         ,0,dwidth,dheight);
      local_bc = (uint)bVar1;
    }
    iVar2 = 0;
    uVar3 = swidth - 1;
    if (uVar3 == x1) {
      bVar1 = stitch_col<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,true,y0,y1,sheight - 1,(int)levels[1],Px,Py,Pz,U,V,Nx,Ny,Nz,
                         x1 - x0,dwidth,dheight);
      iVar2 = -(uint)bVar1;
    }
    uVar5 = 0;
    if (y0 == 0) {
      bVar1 = stitch_row<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,false,x0,x1,uVar3,(int)*levels,Px,Py,Pz,U,V,Nx,Ny,Nz,0,
                         dwidth,dheight);
      uVar5 = (uint)bVar1;
    }
    iVar4 = 0;
    if (sheight - 1 == y1) {
      bVar1 = stitch_row<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                        (patch,subPatch,true,x0,x1,uVar3,(int)levels[2],Px,Py,Pz,U,V,Nx,Ny,Nz,
                         y1 - y0,dwidth,dheight);
      iVar4 = -(uint)bVar1;
    }
  }
  uVar3 = uVar5 * dwidth + local_bc;
  Nx_00 = Nx + uVar3;
  if (Nx == (float *)0x0) {
    Nx_00 = (float *)0x0;
  }
  Ny_00 = Ny + uVar3;
  if (Ny == (float *)0x0) {
    Ny_00 = (float *)0x0;
  }
  Nz_00 = Nz + uVar3;
  if (Nz == (float *)0x0) {
    Nz_00 = (float *)0x0;
  }
  FeatureAdaptiveEvalGrid::FeatureAdaptiveEvalGrid
            (&local_98,patch,subPatch,x0 + local_bc,iVar2 + x1,y0 + uVar5,iVar4 + y1,swidth,sheight,
             Px + uVar3,Py + uVar3,Pz + uVar3,U + uVar3,V + uVar3,Nx_00,Ny_00,Nz_00,dwidth,dheight);
  return;
}

Assistant:

void feature_adaptive_eval_grid (const Patch& patch, unsigned subPatch, const float levels[4],
                                     const unsigned x0, const unsigned x1, const unsigned y0, const unsigned y1, const unsigned swidth, const unsigned sheight, 
                                     float* Px, float* Py, float* Pz, float* U, float* V, float* Nx, float* Ny, float* Nz, const unsigned dwidth, const unsigned dheight)
    {
      bool sl = false, sr = false, st = false, sb = false;
      if (levels) {
        sl = x0 == 0         && stitch_col<Eval,Patch>(patch,subPatch,0,y0,y1,sheight-1,int(levels[3]), Px,Py,Pz,U,V,Nx,Ny,Nz, 0    ,dwidth,dheight);
        sr = x1 == swidth-1  && stitch_col<Eval,Patch>(patch,subPatch,1,y0,y1,sheight-1,int(levels[1]), Px,Py,Pz,U,V,Nx,Ny,Nz, x1-x0,dwidth,dheight);
        st = y0 == 0         && stitch_row<Eval,Patch>(patch,subPatch,0,x0,x1,swidth-1,int(levels[0]), Px,Py,Pz,U,V,Nx,Ny,Nz, 0    ,dwidth,dheight);
        sb = y1 == sheight-1 && stitch_row<Eval,Patch>(patch,subPatch,1,x0,x1,swidth-1,int(levels[2]), Px,Py,Pz,U,V,Nx,Ny,Nz, y1-y0,dwidth,dheight);
      }
      const unsigned ofs = st*dwidth+sl;
      Eval(patch,subPatch,x0+sl,x1-sr,y0+st,y1-sb, swidth,sheight, Px+ofs,Py+ofs,Pz+ofs,U+ofs,V+ofs,Nx?Nx+ofs:nullptr,Ny?Ny+ofs:nullptr,Nz?Nz+ofs:nullptr, dwidth,dheight);
    }